

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O1

void __thiscall
gutil::Properties::getString(Properties *this,char *key,string *value,char *defvalue)

{
  char *pcVar1;
  const_iterator cVar2;
  IOException *this_00;
  allocator local_71;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,key,(allocator *)&local_50);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar2._M_node == &(this->data)._M_t._M_impl.super__Rb_tree_header) {
    if (defvalue == (char *)0x0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_50,key,&local_71);
      std::operator+(&local_70,"Key not found: ",&local_50);
      IOException::IOException(this_00,&local_70);
      __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
    }
    pcVar1 = (char *)value->_M_string_length;
    strlen(defvalue);
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar1,(ulong)defvalue);
  }
  else {
    std::__cxx11::string::_M_assign((string *)value);
  }
  return;
}

Assistant:

void Properties::getString(const char *key, std::string &value,
                           const char *defvalue) const
{
  std::map<std::string, std::string>::const_iterator it=data.find(key);

  if (it != data.end())
  {
    value=it->second;
  }
  else if (defvalue != 0)
  {
    value=defvalue;
  }
  else
  {
    throw IOException("Key not found: "+std::string(key));
  }
}